

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_init(nk_context *ctx,nk_allocator *alloc,nk_user_font *font)

{
  nk_plugin_alloc p_Var1;
  
  if (alloc != (nk_allocator *)0x0) {
    nk_setup(ctx,font);
    nk_buffer_init(&ctx->memory,alloc,0x1000);
    nk_zero(&ctx->pool,0x48);
    (ctx->pool).alloc.free = alloc->free;
    p_Var1 = alloc->alloc;
    (ctx->pool).alloc.userdata = alloc->userdata;
    (ctx->pool).alloc.alloc = p_Var1;
    (ctx->pool).capacity = 0x10;
    (ctx->pool).type = NK_BUFFER_DYNAMIC;
    (ctx->pool).pages = (nk_page *)0x0;
    ctx->use_pool = 1;
    return 1;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x43c9,
                "int nk_init(struct nk_context *, struct nk_allocator *, const struct nk_user_font *)"
               );
}

Assistant:

NK_API int
nk_init(struct nk_context *ctx, struct nk_allocator *alloc,
    const struct nk_user_font *font)
{
    NK_ASSERT(alloc);
    if (!alloc) return 0;
    nk_setup(ctx, font);
    nk_buffer_init(&ctx->memory, alloc, NK_DEFAULT_COMMAND_BUFFER_SIZE);
    nk_pool_init(&ctx->pool, alloc, NK_POOL_DEFAULT_CAPACITY);
    ctx->use_pool = nk_true;
    return 1;
}